

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preBegin__profile_GLSL__technique__pass__states__front_face
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  bool bVar1;
  bool bVar2;
  ulong in_RAX;
  undefined8 *puVar3;
  StringHash SVar4;
  undefined4 uVar5;
  long lVar6;
  xmlChar **ppxVar7;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puVar3 = (undefined8 *)
           GeneratedSaxParser::StackMemoryManager::newObject
                     (&(this->
                       super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                       ).super_ParserTemplateBase.mStackMemoryManager,0x10);
  *puVar3 = 1;
  puVar3[1] = 0;
  *attributeDataPtr = puVar3;
  ppxVar7 = attributes->attributes;
  bVar2 = true;
  if (ppxVar7 != (xmlChar **)0x0) {
    do {
      text = *ppxVar7;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
        additionalText = ppxVar7[1];
        ppxVar7 = ppxVar7 + 2;
        if (SVar4 == 0x76887d) {
          puVar3[1] = additionalText;
        }
        else if (SVar4 == 0x7c83b5) {
          SVar4 = GeneratedSaxParser::Utils::calculateStringHash
                            (additionalText,(bool *)((long)&uStack_38 + 7));
          lVar6 = 0;
          bVar2 = false;
          do {
            if (*(StringHash *)((long)&ENUM__gl_front_face_enumMap + lVar6) == SVar4) {
              uStack_38 = uStack_38 & 0xffffffffffffff;
              validationDataPtr = (void **)(ulong)*(uint *)((long)&DAT_0085ae08 + lVar6);
            }
            uVar5 = SUB84(validationDataPtr,0);
            if (*(StringHash *)((long)&ENUM__gl_front_face_enumMap + lVar6) == SVar4) break;
            lVar6 = lVar6 + 0x10;
            bVar2 = lVar6 != 0x10;
          } while (lVar6 == 0x10);
          if (bVar2) {
            uStack_38 = CONCAT17(1,(undefined7)uStack_38);
            uVar5 = 2;
          }
          *(undefined4 *)puVar3 = uVar5;
          if (uStack_38._7_1_ == '\x01') {
            bVar2 = false;
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x5a31ef5,0x7c83b5,additionalText);
            if (!bVar1) goto LAB_00732eea;
            validationDataPtr = (void **)0x1;
          }
          else {
LAB_00732eea:
            validationDataPtr = (void **)0x4;
            bVar2 = true;
          }
          if (!bVar2) goto LAB_00732ef9;
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x5a31ef5,text,additionalText);
          validationDataPtr = (void **)0x1;
          if (bVar2) goto LAB_00732ef9;
        }
        validationDataPtr = (void **)0x0;
      }
LAB_00732ef9:
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr == 3) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__profile_GLSL__technique__pass__states__front_face( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLSL__technique__pass__states__front_face( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLSL__technique__pass__states__front_face__AttributeData* attributeData = newData<profile_GLSL__technique__pass__states__front_face__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
attributeData->value = Utils::toEnum<ENUM__gl_front_face_enum, StringHash, ENUM__gl_front_face_enum__COUNT>(attributeValue, failed, ENUM__gl_front_face_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_FRONT_FACE,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_FRONT_FACE,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_FRONT_FACE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}